

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FirewirePort.cpp
# Opt level: O3

bool __thiscall
FirewirePort::WriteBlockNode
          (FirewirePort *this,nodeid_t node,nodeaddr_t addr,quadlet_t *wdata,uint nbytes,
          uchar param_5)

{
  int iVar1;
  bool bVar2;
  long *local_50 [2];
  long local_40 [2];
  
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"FirewirePort::WriteBlock","");
  iVar1 = (*(this->super_BasePort)._vptr_BasePort[0x1b])(this,(string *)local_50,0);
  if (local_50[0] != local_40) {
    operator_delete(local_50[0],local_40[0] + 1);
  }
  if ((char)iVar1 == '\0') {
    bVar2 = false;
  }
  else {
    (this->super_BasePort).rtWrite = true;
    iVar1 = raw1394_write(this->handle,node + this->baseNodeId,addr,nbytes,wdata);
    bVar2 = iVar1 == 0;
  }
  return bVar2;
}

Assistant:

bool FirewirePort::WriteBlockNode(nodeid_t node, nodeaddr_t addr, quadlet_t *wdata,
                                  unsigned int nbytes, unsigned char)
{
    if (!CheckFwBusGeneration("FirewirePort::WriteBlock"))
        return false;

    rtWrite = true;   // for debugging
    return !raw1394_write(handle, baseNodeId+node, addr, nbytes, wdata);
}